

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderNaive.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::ssc::SscReaderNaive::BeginStep
          (SscReaderNaive *this,StepMode stepMode,float timeoutSeconds,bool readerLocked)

{
  ulong uVar1;
  ulong uVar2;
  DataType DVar3;
  DataType DVar4;
  DataType DVar5;
  uint8_t *puVar6;
  uint8_t *__src;
  unsigned_long *puVar7;
  char *pcVar8;
  char *__src_00;
  size_type sVar9;
  Variable *pVVar10;
  byte in_DL;
  key_type *__k;
  long in_RDI;
  Variable<std::complex<double>_> *variable_15;
  Variable<std::complex<float>_> *variable_14;
  Variable<long_double> *variable_13;
  Variable<double> *variable_12;
  Variable<float> *variable_11;
  Variable<unsigned_long> *variable_10;
  Variable<unsigned_int> *variable_9;
  Variable<unsigned_short> *variable_8;
  Variable<unsigned_char> *variable_7;
  Variable<long> *variable_6;
  Variable<int> *variable_5;
  Variable<short> *variable_4;
  Variable<signed_char> *variable_3;
  Variable<char> *variable_2;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable;
  vector<char,_std::allocator<char>_> value;
  BlockInfo b;
  uint8_t shapeId;
  uint64_t end;
  uint64_t start;
  uint64_t pos;
  Buffer tmp;
  int globalSize;
  undefined1 in_stack_000008ff;
  IO *in_stack_00000900;
  uint64_t *in_stack_00000908;
  Buffer *in_stack_00000910;
  undefined1 in_stack_00001c1f;
  IO *in_stack_00001c20;
  BlockInfo *in_stack_00001c28;
  uint64_t *in_stack_00001c30;
  ShapeID in_stack_00001c3c;
  Buffer *in_stack_00001c40;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_00001c50;
  size_t sVar11;
  int in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  allocator *in_stack_fffffffffffff890;
  allocator *in_stack_fffffffffffff898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff8a8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffff8b0;
  size_t in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_fffffffffffffa60;
  DataType in_stack_fffffffffffffa6c;
  Variable *in_stack_fffffffffffffa70;
  uint64_t *in_stack_fffffffffffffa78;
  Buffer *in_stack_fffffffffffffa80;
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [39];
  undefined1 local_301 [40];
  allocator local_2d9;
  string local_2d8 [32];
  Variable *local_2b8;
  Variable *local_2b0;
  Variable *local_2a8;
  Variable *local_2a0;
  Variable *local_298;
  Variable *local_290;
  Variable *local_288;
  Variable *local_280;
  Variable *local_278;
  Variable *local_270;
  Variable *local_268;
  Variable *local_260;
  Variable *local_258;
  Variable *local_250;
  Variable *local_248;
  allocator<char> local_239;
  char *local_238;
  char *local_230;
  string local_228 [39];
  allocator<char> local_201;
  char *local_200;
  char *local_1f8;
  string local_1f0 [39];
  allocator<char> local_1c9;
  char *local_1c8;
  char *local_1c0;
  string local_1b8 [32];
  Variable *local_198;
  allocator<char> local_189;
  vector<char,_std::allocator<char>_> local_188 [3];
  DataType local_130;
  int local_120;
  long local_a0;
  vector<char,_std::allocator<char>_> vStack_90;
  uint8_t local_61;
  ulong local_60;
  size_t local_58;
  ulong local_50;
  Buffer local_38;
  int local_20;
  byte local_19;
  StepStatus local_4;
  
  local_19 = in_DL & 1;
  Buffer::clear((Buffer *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
           *)0x1fe7a7);
  *(long *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + 1;
  if (*(int *)(in_RDI + 0x28) == 0) {
    sVar11 = 0;
    MPI_Recv(&local_20,1,&ompi_mpi_int,*(undefined4 *)(in_RDI + 0x30),0,
             *(undefined8 *)(in_RDI + 0x10));
    Buffer::resize((Buffer *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
    Buffer::Buffer((Buffer *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),sVar11);
    puVar6 = Buffer::data(&local_38,0);
    MPI_Recv(puVar6,local_20,&ompi_mpi_char,*(undefined4 *)(in_RDI + 0x30),0,
             *(undefined8 *)(in_RDI + 0x10),0);
    puVar6 = Buffer::data((Buffer *)(in_RDI + 0x70),0);
    __src = Buffer::data(&local_38,0);
    memcpy(puVar6,__src,(long)local_20);
    Buffer::~Buffer((Buffer *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  }
  MPI_Bcast(&local_20,1,&ompi_mpi_int,0,*(undefined8 *)(in_RDI + 0x18));
  if (*(int *)(in_RDI + 0x28) != 0) {
    Buffer::resize((Buffer *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   in_stack_fffffffffffff948);
  }
  if (local_20 == 1) {
    local_4 = EndOfStream;
  }
  else {
    puVar6 = Buffer::data((Buffer *)(in_RDI + 0x70),0);
    MPI_Bcast(puVar6,local_20,&ompi_mpi_char,0,*(undefined8 *)(in_RDI + 0x18));
    local_50 = 0;
    while (uVar1 = local_50, sVar11 = Buffer::size((Buffer *)(in_RDI + 0x70)), uVar2 = local_50,
          uVar1 < sVar11) {
      local_58 = local_50;
      puVar7 = Buffer::value<unsigned_long>((Buffer *)(in_RDI + 0x70),local_50);
      local_60 = uVar2 + *puVar7;
      puVar7 = Buffer::value<unsigned_long>((Buffer *)(in_RDI + 0x70),local_50 + 8);
      local_50 = *puVar7 + local_50;
      while (local_50 < local_60) {
        puVar6 = Buffer::operator[]((Buffer *)(in_RDI + 0x70),local_50);
        local_61 = *puVar6;
        if (local_61 == 'A') {
          local_50 = local_50 + 1;
          DeserializeStructDefinitions
                    (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (IO *)in_stack_fffffffffffffa70,SUB41(in_stack_fffffffffffffa6c >> 0x18,0),
                     in_stack_fffffffffffffa60);
        }
        else if (local_61 == 'B') {
          local_50 = local_50 + 1;
          DeserializeAttribute
                    (in_stack_00000910,in_stack_00000908,in_stack_00000900,(bool)in_stack_000008ff);
        }
        else {
          local_50 = local_50 + 5;
          BlockInfo::BlockInfo
                    ((BlockInfo *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
          __k = (key_type *)(in_RDI + 0x38);
          DeserializeVariable(in_stack_00001c40,in_stack_00001c3c,in_stack_00001c30,
                              in_stack_00001c28,in_stack_00001c20,(bool)in_stack_00001c1f,
                              in_stack_00001c50);
          local_a0 = local_a0 + local_58;
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),__k);
          std::
          vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
          ::push_back((vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                       *)in_stack_fffffffffffff890,
                      (value_type *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          if ((local_120 == 1) || (local_120 == 4)) {
            std::allocator<char>::allocator();
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8a0,
                       (size_type)in_stack_fffffffffffff898,
                       (allocator_type *)in_stack_fffffffffffff890);
            std::allocator<char>::~allocator(&local_189);
            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)0x1fec84);
            __src_00 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x1feca0);
            sVar9 = std::vector<char,_std::allocator<char>_>::size(&vStack_90);
            memcpy(pcVar8,__src_00,sVar9);
            DVar5 = local_130;
            if (local_130 == String) {
              local_198 = adios2::core::IO::InquireVariable<std::__cxx11::string>
                                    (*(string **)(in_RDI + 0xc0));
              if (local_198 != (Variable *)0x0) {
                local_1c0 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                              ((vector<char,_std::allocator<char>_> *)__k);
                local_1c8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                              ((vector<char,_std::allocator<char>_> *)__k);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                          (in_stack_fffffffffffff8a0,in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8a8,(allocator<char> *)in_stack_fffffffffffff898);
                std::__cxx11::string::operator=((string *)(local_198 + 0x268),local_1b8);
                std::__cxx11::string::~string(local_1b8);
                std::allocator<char>::~allocator(&local_1c9);
                local_1f8 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                              ((vector<char,_std::allocator<char>_> *)__k);
                local_200 = (char *)std::vector<char,_std::allocator<char>_>::end
                                              ((vector<char,_std::allocator<char>_> *)__k);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                          (in_stack_fffffffffffff8a0,in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8a8,(allocator<char> *)in_stack_fffffffffffff898);
                std::__cxx11::string::operator=((string *)(local_198 + 0x228),local_1f0);
                std::__cxx11::string::~string(local_1f0);
                std::allocator<char>::~allocator(&local_201);
                local_230 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                              ((vector<char,_std::allocator<char>_> *)__k);
                local_238 = (char *)std::vector<char,_std::allocator<char>_>::end
                                              ((vector<char,_std::allocator<char>_> *)__k);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                          (in_stack_fffffffffffff8a0,in_stack_fffffffffffff8b0,
                           in_stack_fffffffffffff8a8,(allocator<char> *)in_stack_fffffffffffff898);
                std::__cxx11::string::operator=((string *)(local_198 + 0x248),local_228);
                std::__cxx11::string::~string(local_228);
                std::allocator<char>::~allocator(&local_239);
              }
            }
            else {
              DVar3 = helper::GetDataType<std::__cxx11::string>();
              DVar4 = local_130;
              if (DVar5 == DVar3) {
                local_248 = adios2::core::IO::InquireVariable<std::__cxx11::string>
                                      (*(string **)(in_RDI + 0xc0));
                if (local_248 != (Variable *)0x0) {
                  pVVar10 = local_248 + 0x228;
                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                     ((vector<char,_std::allocator<char>_> *)0x1ff046);
                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                  memcpy(pVVar10,pcVar8,sVar9);
                  pVVar10 = local_248 + 0x248;
                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                     ((vector<char,_std::allocator<char>_> *)0x1ff096);
                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                  memcpy(pVVar10,pcVar8,sVar9);
                  pVVar10 = local_248 + 0x268;
                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                     ((vector<char,_std::allocator<char>_> *)0x1ff0e6);
                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                  memcpy(pVVar10,pcVar8,sVar9);
                }
              }
              else {
                DVar3 = helper::GetDataType<char>();
                DVar5 = local_130;
                if (DVar4 == DVar3) {
                  local_250 = adios2::core::IO::InquireVariable<char>(*(string **)(in_RDI + 0xc0));
                  if (local_250 != (Variable *)0x0) {
                    pVVar10 = local_250 + 0x228;
                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                       ((vector<char,_std::allocator<char>_> *)0x1ff192);
                    sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                    memcpy(pVVar10,pcVar8,sVar9);
                    pVVar10 = local_250 + 0x229;
                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                       ((vector<char,_std::allocator<char>_> *)0x1ff1e2);
                    sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                    memcpy(pVVar10,pcVar8,sVar9);
                    pVVar10 = local_250 + 0x22a;
                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                       ((vector<char,_std::allocator<char>_> *)0x1ff232);
                    sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                    memcpy(pVVar10,pcVar8,sVar9);
                  }
                }
                else {
                  DVar3 = helper::GetDataType<signed_char>();
                  DVar4 = local_130;
                  if (DVar5 == DVar3) {
                    local_258 = adios2::core::IO::InquireVariable<signed_char>
                                          (*(string **)(in_RDI + 0xc0));
                    if (local_258 != (Variable *)0x0) {
                      pVVar10 = local_258 + 0x228;
                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                         ((vector<char,_std::allocator<char>_> *)0x1ff2de);
                      sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                      memcpy(pVVar10,pcVar8,sVar9);
                      pVVar10 = local_258 + 0x229;
                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                         ((vector<char,_std::allocator<char>_> *)0x1ff32e);
                      sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                      memcpy(pVVar10,pcVar8,sVar9);
                      pVVar10 = local_258 + 0x22a;
                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                         ((vector<char,_std::allocator<char>_> *)0x1ff37e);
                      sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                      memcpy(pVVar10,pcVar8,sVar9);
                    }
                  }
                  else {
                    DVar3 = helper::GetDataType<short>();
                    DVar5 = local_130;
                    if (DVar4 == DVar3) {
                      local_260 = adios2::core::IO::InquireVariable<short>
                                            (*(string **)(in_RDI + 0xc0));
                      if (local_260 != (Variable *)0x0) {
                        pVVar10 = local_260 + 0x228;
                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                           ((vector<char,_std::allocator<char>_> *)0x1ff42a);
                        sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                        memcpy(pVVar10,pcVar8,sVar9);
                        pVVar10 = local_260 + 0x22a;
                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                           ((vector<char,_std::allocator<char>_> *)0x1ff47a);
                        sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                        memcpy(pVVar10,pcVar8,sVar9);
                        pVVar10 = local_260 + 0x22c;
                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                           ((vector<char,_std::allocator<char>_> *)0x1ff4ca);
                        sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                        memcpy(pVVar10,pcVar8,sVar9);
                      }
                    }
                    else {
                      DVar3 = helper::GetDataType<int>();
                      DVar4 = local_130;
                      if (DVar5 == DVar3) {
                        local_268 = adios2::core::IO::InquireVariable<int>
                                              (*(string **)(in_RDI + 0xc0));
                        if (local_268 != (Variable *)0x0) {
                          pVVar10 = local_268 + 0x228;
                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)0x1ff576);
                          sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                          memcpy(pVVar10,pcVar8,sVar9);
                          pVVar10 = local_268 + 0x22c;
                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)0x1ff5c6);
                          sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                          memcpy(pVVar10,pcVar8,sVar9);
                          pVVar10 = local_268 + 0x230;
                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)0x1ff616);
                          sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                          memcpy(pVVar10,pcVar8,sVar9);
                        }
                      }
                      else {
                        DVar3 = helper::GetDataType<long>();
                        DVar5 = local_130;
                        if (DVar4 == DVar3) {
                          local_270 = adios2::core::IO::InquireVariable<long>
                                                (*(string **)(in_RDI + 0xc0));
                          if (local_270 != (Variable *)0x0) {
                            pVVar10 = local_270 + 0x228;
                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                               ((vector<char,_std::allocator<char>_> *)0x1ff6c2);
                            sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                            memcpy(pVVar10,pcVar8,sVar9);
                            pVVar10 = local_270 + 0x230;
                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                               ((vector<char,_std::allocator<char>_> *)0x1ff712);
                            sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                            memcpy(pVVar10,pcVar8,sVar9);
                            pVVar10 = local_270 + 0x238;
                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                               ((vector<char,_std::allocator<char>_> *)0x1ff762);
                            sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                            memcpy(pVVar10,pcVar8,sVar9);
                          }
                        }
                        else {
                          DVar4 = helper::GetDataType<unsigned_char>();
                          if (DVar5 == DVar4) {
                            local_278 = adios2::core::IO::InquireVariable<unsigned_char>
                                                  (*(string **)(in_RDI + 0xc0));
                            if (local_278 != (Variable *)0x0) {
                              in_stack_fffffffffffffa70 = local_278 + 0x228;
                              in_stack_fffffffffffffa78 =
                                   (uint64_t *)
                                   std::vector<char,_std::allocator<char>_>::data
                                             ((vector<char,_std::allocator<char>_> *)0x1ff80e);
                              sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                              memcpy(in_stack_fffffffffffffa70,in_stack_fffffffffffffa78,sVar9);
                              in_stack_fffffffffffffa80 = (Buffer *)(local_278 + 0x229);
                              pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                 ((vector<char,_std::allocator<char>_> *)0x1ff85e);
                              sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                              memcpy(in_stack_fffffffffffffa80,pcVar8,sVar9);
                              pVVar10 = local_278 + 0x22a;
                              pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                 ((vector<char,_std::allocator<char>_> *)0x1ff8ae);
                              sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                              memcpy(pVVar10,pcVar8,sVar9);
                            }
                          }
                          else {
                            in_stack_fffffffffffffa6c = local_130;
                            DVar4 = helper::GetDataType<unsigned_short>();
                            DVar5 = local_130;
                            if (in_stack_fffffffffffffa6c == DVar4) {
                              local_280 = adios2::core::IO::InquireVariable<unsigned_short>
                                                    (*(string **)(in_RDI + 0xc0));
                              if (local_280 != (Variable *)0x0) {
                                pVVar10 = local_280 + 0x228;
                                pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                   ((vector<char,_std::allocator<char>_> *)0x1ff95a)
                                ;
                                sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                memcpy(pVVar10,pcVar8,sVar9);
                                pVVar10 = local_280 + 0x22a;
                                pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                   ((vector<char,_std::allocator<char>_> *)0x1ff9aa)
                                ;
                                sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                memcpy(pVVar10,pcVar8,sVar9);
                                pVVar10 = local_280 + 0x22c;
                                in_stack_fffffffffffffa60 =
                                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                                      *)std::vector<char,_std::allocator<char>_>::data
                                                  ((vector<char,_std::allocator<char>_> *)0x1ff9fa);
                                sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                memcpy(pVVar10,in_stack_fffffffffffffa60,sVar9);
                              }
                            }
                            else {
                              DVar3 = helper::GetDataType<unsigned_int>();
                              DVar4 = local_130;
                              if (DVar5 == DVar3) {
                                local_288 = adios2::core::IO::InquireVariable<unsigned_int>
                                                      (*(string **)(in_RDI + 0xc0));
                                if (local_288 != (Variable *)0x0) {
                                  pVVar10 = local_288 + 0x228;
                                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      0x1ffaa6);
                                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                  memcpy(pVVar10,pcVar8,sVar9);
                                  pVVar10 = local_288 + 0x22c;
                                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      0x1ffaf6);
                                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                  memcpy(pVVar10,pcVar8,sVar9);
                                  pVVar10 = local_288 + 0x230;
                                  pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                     ((vector<char,_std::allocator<char>_> *)
                                                      0x1ffb46);
                                  sVar9 = std::vector<char,_std::allocator<char>_>::size(local_188);
                                  memcpy(pVVar10,pcVar8,sVar9);
                                }
                              }
                              else {
                                DVar3 = helper::GetDataType<unsigned_long>();
                                DVar5 = local_130;
                                if (DVar4 == DVar3) {
                                  local_290 = adios2::core::IO::InquireVariable<unsigned_long>
                                                        (*(string **)(in_RDI + 0xc0));
                                  if (local_290 != (Variable *)0x0) {
                                    pVVar10 = local_290 + 0x228;
                                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                       ((vector<char,_std::allocator<char>_> *)
                                                        0x1ffbf2);
                                    sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                      (local_188);
                                    memcpy(pVVar10,pcVar8,sVar9);
                                    pVVar10 = local_290 + 0x230;
                                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                       ((vector<char,_std::allocator<char>_> *)
                                                        0x1ffc42);
                                    sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                      (local_188);
                                    memcpy(pVVar10,pcVar8,sVar9);
                                    pVVar10 = local_290 + 0x238;
                                    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                       ((vector<char,_std::allocator<char>_> *)
                                                        0x1ffc92);
                                    sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                      (local_188);
                                    memcpy(pVVar10,pcVar8,sVar9);
                                  }
                                }
                                else {
                                  DVar3 = helper::GetDataType<float>();
                                  DVar4 = local_130;
                                  if (DVar5 == DVar3) {
                                    local_298 = adios2::core::IO::InquireVariable<float>
                                                          (*(string **)(in_RDI + 0xc0));
                                    if (local_298 != (Variable *)0x0) {
                                      pVVar10 = local_298 + 0x228;
                                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          0x1ffd3e);
                                      sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                        (local_188);
                                      memcpy(pVVar10,pcVar8,sVar9);
                                      pVVar10 = local_298 + 0x22c;
                                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          0x1ffd8e);
                                      sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                        (local_188);
                                      memcpy(pVVar10,pcVar8,sVar9);
                                      pVVar10 = local_298 + 0x230;
                                      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                         ((vector<char,_std::allocator<char>_> *)
                                                          0x1ffdde);
                                      sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                        (local_188);
                                      memcpy(pVVar10,pcVar8,sVar9);
                                    }
                                  }
                                  else {
                                    DVar5 = helper::GetDataType<double>();
                                    if (DVar4 == DVar5) {
                                      local_2a0 = adios2::core::IO::InquireVariable<double>
                                                            (*(string **)(in_RDI + 0xc0));
                                      if (local_2a0 != (Variable *)0x0) {
                                        pVVar10 = local_2a0 + 0x228;
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            0x1ffe8a);
                                        sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                          (local_188);
                                        memcpy(pVVar10,pcVar8,sVar9);
                                        pVVar10 = local_2a0 + 0x230;
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            0x1ffeda);
                                        sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                          (local_188);
                                        memcpy(pVVar10,pcVar8,sVar9);
                                        pVVar10 = local_2a0 + 0x238;
                                        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            0x1fff2a);
                                        sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                          (local_188);
                                        memcpy(pVVar10,pcVar8,sVar9);
                                      }
                                    }
                                    else {
                                      DVar4 = local_130;
                                      DVar3 = helper::GetDataType<long_double>();
                                      DVar5 = local_130;
                                      if (DVar4 == DVar3) {
                                        local_2a8 = adios2::core::IO::InquireVariable<long_double>
                                                              (*(string **)(in_RDI + 0xc0));
                                        if (local_2a8 != (Variable *)0x0) {
                                          pVVar10 = local_2a8 + 0x230;
                                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                             ((vector<char,_std::allocator<char>_> *
                                                              )0x1fffd6);
                                          sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                            (local_188);
                                          memcpy(pVVar10,pcVar8,sVar9);
                                          pVVar10 = local_2a8 + 0x240;
                                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                             ((vector<char,_std::allocator<char>_> *
                                                              )0x200026);
                                          sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                            (local_188);
                                          memcpy(pVVar10,pcVar8,sVar9);
                                          pVVar10 = local_2a8 + 0x250;
                                          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                             ((vector<char,_std::allocator<char>_> *
                                                              )0x200076);
                                          sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                            (local_188);
                                          memcpy(pVVar10,pcVar8,sVar9);
                                        }
                                      }
                                      else {
                                        DVar3 = helper::GetDataType<std::complex<float>>();
                                        DVar4 = local_130;
                                        if (DVar5 == DVar3) {
                                          local_2b0 = adios2::core::IO::
                                                      InquireVariable<std::complex<float>>
                                                                (*(string **)(in_RDI + 0xc0));
                                          if (local_2b0 != (Variable *)0x0) {
                                            pVVar10 = local_2b0 + 0x228;
                                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                               ((vector<char,_std::allocator<char>_>
                                                                 *)0x20011f);
                                            sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                              (local_188);
                                            memcpy(pVVar10,pcVar8,sVar9);
                                            pVVar10 = local_2b0 + 0x230;
                                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                               ((vector<char,_std::allocator<char>_>
                                                                 *)0x200166);
                                            sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                              (local_188);
                                            memcpy(pVVar10,pcVar8,sVar9);
                                            pVVar10 = local_2b0 + 0x238;
                                            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                                               ((vector<char,_std::allocator<char>_>
                                                                 *)0x2001b6);
                                            sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                              (local_188);
                                            memcpy(pVVar10,pcVar8,sVar9);
                                          }
                                        }
                                        else {
                                          DVar5 = helper::GetDataType<std::complex<double>>();
                                          if (DVar4 == DVar5) {
                                            local_2b8 = adios2::core::IO::
                                                        InquireVariable<std::complex<double>>
                                                                  (*(string **)(in_RDI + 0xc0));
                                            if (local_2b8 != (Variable *)0x0) {
                                              in_stack_fffffffffffff8b0._M_current =
                                                   (char *)(local_2b8 + 0x228);
                                              pcVar8 = std::vector<char,_std::allocator<char>_>::
                                                       data((vector<char,_std::allocator<char>_> *)
                                                            0x200259);
                                              sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                                (local_188);
                                              memcpy(in_stack_fffffffffffff8b0._M_current,pcVar8,
                                                     sVar9);
                                              pVVar10 = local_2b8 + 0x238;
                                              pcVar8 = std::vector<char,_std::allocator<char>_>::
                                                       data((vector<char,_std::allocator<char>_> *)
                                                            0x20029d);
                                              sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                                (local_188);
                                              memcpy(pVVar10,pcVar8,sVar9);
                                              pVVar10 = local_2b8 + 0x248;
                                              pcVar8 = std::vector<char,_std::allocator<char>_>::
                                                       data((vector<char,_std::allocator<char>_> *)
                                                            0x2002e1);
                                              sVar9 = std::vector<char,_std::allocator<char>_>::size
                                                                (local_188);
                                              memcpy(pVVar10,pcVar8,sVar9);
                                            }
                                          }
                                          else {
                                            in_stack_fffffffffffff8a8._M_current =
                                                 (char *)&local_2d9;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_2d8,"Engine",
                                                       (allocator *)
                                                       in_stack_fffffffffffff8a8._M_current);
                                            in_stack_fffffffffffff8a0 =
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_301;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      ((string *)(local_301 + 1),"SscReaderNaive",
                                                       (allocator *)in_stack_fffffffffffff8a0);
                                            in_stack_fffffffffffff898 = &local_329;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_328,"BeginStep",
                                                       in_stack_fffffffffffff898);
                                            in_stack_fffffffffffff890 = &local_351;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string
                                                      (local_350,"unknown data type",
                                                       in_stack_fffffffffffff890);
                                            in_stack_fffffffffffff880 = *(int *)(in_RDI + 0xb0);
                                            in_stack_fffffffffffff888 = 0x65;
                                            adios2::helper::Log(local_2d8,(string *)(local_301 + 1),
                                                                local_328,local_350,
                                                                *(int *)(in_RDI + 0x28),
                                                                *(int *)(in_RDI + 0x28),0,
                                                                in_stack_fffffffffffff880,FATALERROR
                                                               );
                                            std::__cxx11::string::~string(local_350);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_351);
                                            std::__cxx11::string::~string(local_328);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_329);
                                            std::__cxx11::string::~string((string *)(local_301 + 1))
                                            ;
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)local_301);
                                            std::__cxx11::string::~string(local_2d8);
                                            std::allocator<char>::~allocator
                                                      ((allocator<char> *)&local_2d9);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            std::vector<char,_std::allocator<char>_>::~vector
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff890);
          }
          BlockInfo::~BlockInfo
                    ((BlockInfo *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
        }
      }
    }
    local_4 = OK;
  }
  return local_4;
}

Assistant:

StepStatus SscReaderNaive::BeginStep(const StepMode stepMode, const float timeoutSeconds,
                                     const bool readerLocked)
{

    m_Buffer.clear();
    m_BlockMap.clear();

    ++m_CurrentStep;

    int globalSize;

    if (m_ReaderRank == 0)
    {
        MPI_Recv(&globalSize, 1, MPI_INT, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        m_Buffer.resize(globalSize);
        //        MPI_Recv(m_Buffer.data(), globalSize, MPI_CHAR,
        //        m_WriterMasterStreamRank, 0, m_StreamComm, MPI_STATUS_IGNORE);
        // TODO: revert when the crusher MPI bug is fixed
        ssc::Buffer tmp(globalSize);
        MPI_Recv(tmp.data(), globalSize, MPI_CHAR, m_WriterMasterStreamRank, 0, m_StreamComm,
                 MPI_STATUS_IGNORE);
        std::memcpy(m_Buffer.data(), tmp.data(), globalSize);
    }

    MPI_Bcast(&globalSize, 1, MPI_INT, 0, m_ReaderComm);
    if (m_ReaderRank != 0)
    {
        m_Buffer.resize(globalSize);
    }
    if (globalSize == 1)
    {
        return StepStatus::EndOfStream;
    }
    MPI_Bcast(m_Buffer.data(), globalSize, MPI_CHAR, 0, m_ReaderComm);

    uint64_t pos = 0;
    while (pos < m_Buffer.size())
    {
        uint64_t start = pos;
        uint64_t end = pos + m_Buffer.value<uint64_t>(pos);
        pos += m_Buffer.value<uint64_t>(pos + 8);

        while (pos < end)
        {
            uint8_t shapeId = m_Buffer[pos];
            ++pos;

            if (shapeId == 65)
            {
                DeserializeStructDefinitions(m_Buffer, pos, m_IO, true, m_StructDefinitions);
            }
            else if (shapeId == 66)
            {
                DeserializeAttribute(m_Buffer, pos, m_IO, true);
            }
            else
            {
                pos += 4;
                ssc::BlockInfo b;
                DeserializeVariable(m_Buffer, static_cast<ShapeID>(shapeId), pos, b, m_IO, true,
                                    m_StructDefinitions);
                b.bufferStart += start;
                m_BlockMap[b.name].push_back(b);
                if (b.shapeId == ShapeID::GlobalValue || b.shapeId == ShapeID::LocalValue)
                {
                    std::vector<char> value(b.bufferCount);
                    std::memcpy(value.data(), b.value.data(), b.value.size());

                    if (b.type == DataType::String)
                    {
                        auto variable = m_IO.InquireVariable<std::string>(b.name);
                        if (variable)
                        {
                            variable->m_Value = std::string(value.begin(), value.end());
                            variable->m_Min = std::string(value.begin(), value.end());
                            variable->m_Max = std::string(value.begin(), value.end());
                        }
                    }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto variable = m_IO.InquireVariable<T>(b.name);                                           \
        if (variable)                                                                              \
        {                                                                                          \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Min), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Max), value.data(), value.size());   \
            std::memcpy(reinterpret_cast<char *>(&variable->m_Value), value.data(), value.size()); \
        }                                                                                          \
    }
                    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
                    else
                    {
                        helper::Log("Engine", "SscReaderNaive", "BeginStep", "unknown data type",
                                    m_ReaderRank, m_ReaderRank, 0, m_Verbosity, helper::FATALERROR);
                    }
                }
            }
        }
    }